

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::String(String *this,int len,char *s)

{
  size_t sVar1;
  uchar *__dest;
  int iVar2;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    (this->super_tagbstring).slen = (int)sVar1;
    iVar2 = (int)sVar1 + 1;
    if (len < iVar2) {
      len = iVar2;
    }
    (this->super_tagbstring).mlen = len;
    __dest = (uchar *)malloc((long)len);
    (this->super_tagbstring).data = __dest;
    if (__dest == (uchar *)0x0) {
      (this->super_tagbstring).mlen = 0;
      (this->super_tagbstring).slen = 0;
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x98,"Failure in (int len, char *) constructor");
      __dest = (this->super_tagbstring).data;
      iVar2 = (this->super_tagbstring).slen + 1;
    }
    memcpy(__dest,s,(long)iVar2);
    return;
  }
  return;
}

Assistant:

String::String(int len, const char *s)
    {
        slen = mlen = 0; data = 0;
        if (s)
        {
            slen = (int)strlen(s);
            mlen = slen + 1;
            if (mlen < len)
                mlen = len;

            data = (uint8 * ) malloc(mlen);
            if (!data)
            {
                mlen = slen = 0;
                bstringThrow("Failure in (int len, char *) constructor");
            }
            memcpy(data, s, slen + 1);
        }
    }